

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaEnc.cpp
# Opt level: O1

SRes crnlib::LzmaEnc_MemEncode
               (CLzmaEncHandle pp,Byte *dest,SizeT *destLen,Byte *src,SizeT srcLen,int writeEndMark,
               ICompressProgress *progress,ISzAlloc *alloc,ISzAlloc *allocBig)

{
  SRes SVar1;
  ISeqOutStream local_30;
  Byte *local_28;
  SizeT local_20;
  int local_18;
  
  *(code **)((long)pp + 0x3d360) = MyRead;
  *(Byte **)((long)pp + 0x3d368) = src;
  *(SizeT *)((long)pp + 0x3d370) = srcLen;
  local_30.Write = MyWrite;
  local_20 = *destLen;
  local_18 = 0;
  *(int *)((long)pp + 0x3d330) = writeEndMark;
  local_28 = dest;
  SVar1 = LzmaEnc_Encode(pp,&local_30,(ISeqInStream *)((long)pp + 0x3d360),progress,alloc,allocBig);
  *destLen = *destLen - local_20;
  if (local_18 != 0) {
    SVar1 = 7;
  }
  return SVar1;
}

Assistant:

SRes LzmaEnc_MemEncode(CLzmaEncHandle pp, Byte* dest, SizeT* destLen, const Byte* src, SizeT srcLen,
                       int writeEndMark, ICompressProgress* progress, ISzAlloc* alloc, ISzAlloc* allocBig) {
  SRes res;
  CLzmaEnc* p = (CLzmaEnc*)pp;

  CSeqOutStreamBuf outStream;

  LzmaEnc_SetInputBuf(p, src, srcLen);

  outStream.funcTable.Write = MyWrite;
  outStream.data = dest;
  outStream.rem = *destLen;
  outStream.overflow = False;

  p->writeEndMark = writeEndMark;
  res = LzmaEnc_Encode(pp, &outStream.funcTable, &p->seqBufInStream.funcTable,
                       progress, alloc, allocBig);

  *destLen -= outStream.rem;
  if (outStream.overflow)
    return SZ_ERROR_OUTPUT_EOF;
  return res;
}